

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.cpp
# Opt level: O2

bool Imath_2_5::anon_unknown_8::normalizeOrThrow<int>(Vec4<int> *v)

{
  ulong uVar1;
  IntVecNormalizeExc *this;
  int iVar2;
  ulong uVar3;
  
  uVar3 = 0xffffffffffffffff;
  uVar1 = 0;
  do {
    iVar2 = (int)uVar3;
    if (uVar1 == 4) {
      (&v->x)[iVar2] = (uint)(0 < (&v->x)[iVar2]) * 2 + -1;
      return SUB81(uVar3,0);
    }
    if ((&v->x)[uVar1] != 0) {
      if (iVar2 != -1) {
        this = (IntVecNormalizeExc *)__cxa_allocate_exception(0x48);
        IntVecNormalizeExc::IntVecNormalizeExc
                  (this,
                   "Cannot normalize an integer vector unless it is parallel to a principal axis");
        __cxa_throw(this,&IntVecNormalizeExc::typeinfo,IntVecNormalizeExc::~IntVecNormalizeExc);
      }
      uVar3 = uVar1 & 0xffffffff;
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

bool
normalizeOrThrow(Vec4<T> &v)
{
    int axis = -1;
    for (int i = 0; i < 4; i ++)
    {
        if (v[i] != 0)
        {
            if (axis != -1)
            {
                throw IntVecNormalizeExc ("Cannot normalize an integer "
                                          "vector unless it is parallel "
                                          "to a principal axis");
            }
            axis = i;
        }
    }
    v[axis] = (v[axis] > 0) ? 1 : -1;
    return true;
}